

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::stop_dht(session_impl *this)

{
  dht_tracker *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  dht_storage_interface *pdVar1;
  char *pcVar2;
  
  pcVar2 = "true";
  if ((this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pcVar2 = "false";
  }
  session_log(this,"about to stop DHT, running: %s",pcVar2);
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    libtorrent::dht::dht_tracker::stop(this_00);
    this_01 = (this->m_dht).
              super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  pdVar1 = (this->m_dht_storage)._M_t.
           super___uniq_ptr_impl<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::dht::dht_storage_interface_*,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
           .super__Head_base<0UL,_libtorrent::dht::dht_storage_interface_*,_false>._M_head_impl;
  (this->m_dht_storage)._M_t.
  super___uniq_ptr_impl<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::dht::dht_storage_interface_*,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  .super__Head_base<0UL,_libtorrent::dht::dht_storage_interface_*,_false>._M_head_impl =
       (dht_storage_interface *)0x0;
  if (pdVar1 != (dht_storage_interface *)0x0) {
    (*pdVar1->_vptr_dht_storage_interface[0xc])();
    return;
  }
  return;
}

Assistant:

void session_impl::stop_dht()
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("about to stop DHT, running: %s", m_dht ? "true" : "false");
#endif

		if (m_dht)
		{
			m_dht->stop();
			m_dht.reset();
		}

		m_dht_storage.reset();
	}